

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

int lj_record_next(jit_State *J,RecordIndex *ix)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  TRef TVar5;
  TRef TVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  IRRef1 IVar10;
  uint unaff_R12D;
  uint uVar11;
  
  uVar9 = (ix->tabv).u64 & 0x7fffffffffff;
  uVar4 = (ix->keyv).u32.lo;
  uVar8 = (ulong)uVar4;
  uVar1 = *(uint *)(uVar9 + 0x30);
  if (uVar4 < uVar1) {
    do {
      lVar2 = *(long *)(*(long *)(uVar9 + 0x10) + uVar8 * 8);
      if ((lVar2 != -1) &&
         (unaff_R12D = ~(uint)(lVar2 >> 0x2f) << 8 | 0xe,
         (ulong)(lVar2 >> 0x2f) < 0xfffffffffffffff2)) {
        unaff_R12D = 0xe0e;
      }
      if (lVar2 != -1) goto LAB_0012fc5d;
      uVar8 = uVar8 + 1;
      uVar4 = uVar1;
    } while (uVar1 != uVar8);
  }
  uVar4 = uVar4 - uVar1;
  if (uVar4 <= *(uint *)(uVar9 + 0x34)) {
    do {
      lVar2 = *(long *)(*(long *)(uVar9 + 0x28) + (ulong)uVar4 * 0x18);
      if (lVar2 != -1) {
        lVar3 = *(long *)(*(long *)(uVar9 + 0x28) + (ulong)uVar4 * 0x18 + 8);
        uVar1 = ~(uint)(lVar3 >> 0x2f);
        if ((ulong)(lVar3 >> 0x2f) < 0xfffffffffffffff2) {
          uVar1 = 0xe;
        }
        uVar11 = ~(uint)(lVar2 >> 0x2f) << 8;
        if ((ulong)(lVar2 >> 0x2f) < 0xfffffffffffffff2) {
          uVar11 = 0xe00;
        }
        unaff_R12D = uVar11 | uVar1;
      }
      if (lVar2 != -1) goto LAB_0012fc5d;
      uVar4 = uVar4 + 1;
    } while (uVar4 <= *(uint *)(uVar9 + 0x34));
  }
  unaff_R12D = 0;
LAB_0012fc5d:
  TVar5 = lj_ir_call(J,IRCALL_lj_vm_next,(ulong)ix->tab,(ulong)ix->key);
  IVar10 = (IRRef1)TVar5;
  if ((ix->mobj != 0) || ((unaff_R12D & 0xff) == 0)) {
    (J->fold).ins.field_0.ot = 0x1013;
    (J->fold).ins.field_0.op1 = IVar10;
    (J->fold).ins.field_0.op2 = IVar10;
    TVar5 = lj_opt_fold(J);
    if (ix->mobj == 0) {
      TVar6 = lj_ir_kint(J,-1);
      (J->fold).ins.field_0.ot = 0x993;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
      lj_opt_fold(J);
    }
    ix->mobj = TVar5;
  }
  (J->fold).ins.field_0.ot = (ushort)(unaff_R12D & 0xff) | 0x4880;
  (J->fold).ins.field_0.op1 = IVar10;
  (J->fold).ins.field_0.op2 = 1;
  TVar6 = lj_opt_fold(J);
  TVar5 = (unaff_R12D & 0xff) * 0xffffff + 0x7fff;
  if (2 < (unaff_R12D & 0xff)) {
    TVar5 = TVar6;
  }
  ix->key = TVar5;
  iVar7 = 1;
  TVar5 = 0x7fff;
  if (((unaff_R12D & 0xff) != 0) && (ix->idxchain == 0)) {
    (J->fold).ins.field_0.ot = (ushort)(unaff_R12D >> 8) | 0x4880;
    (J->fold).ins.field_0.op1 = IVar10;
    (J->fold).ins.field_0.op2 = 0;
    TVar6 = lj_opt_fold(J);
    TVar5 = (unaff_R12D >> 8) * 0xffffff + 0x7fff;
    if (0x2ff < unaff_R12D) {
      TVar5 = TVar6;
    }
    iVar7 = 2;
  }
  ix->val = TVar5;
  return iVar7;
}

Assistant:

int lj_record_next(jit_State *J, RecordIndex *ix)
{
  IRType t, tkey, tval;
  TRef trvk;
  t = rec_next_types(tabV(&ix->tabv), ix->keyv.u32.lo);
  tkey = (t & 0xff); tval = (t >> 8);
  trvk = lj_ir_call(J, IRCALL_lj_vm_next, ix->tab, ix->key);
  if (ix->mobj || tkey == IRT_NIL) {
    TRef idx = emitir(IRTI(IR_HIOP), trvk, trvk);
    /* Always check for invalid key from next() for nil result. */
    if (!ix->mobj) emitir(IRTGI(IR_NE), idx, lj_ir_kint(J, -1));
    ix->mobj = idx;
  }
  ix->key = lj_record_vload(J, trvk, 1, tkey);
  if (tkey == IRT_NIL || ix->idxchain) {  /* Omit value type check. */
    ix->val = TREF_NIL;
    return 1;
  } else {  /* Need value. */
    ix->val = lj_record_vload(J, trvk, 0, tval);
    return 2;
  }
}